

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  undefined8 uVar1;
  code *pcVar2;
  long lVar3;
  FILE *__stream;
  Iterator IVar4;
  usize uVar5;
  int iVar6;
  uint32 uVar7;
  int *piVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  char **in_RCX;
  long lVar12;
  Iterator i_1;
  undefined1 this_00 [8];
  uint in_R8D;
  Map<String,_String> *in_R9;
  Iterator end;
  char **ppcVar13;
  char **ppcVar14;
  long lStack_80;
  char *pcStack_78;
  char **local_70;
  undefined1 auStack_68 [8];
  Array<String> envStringsBuf;
  int local_48 [2];
  int stdoutFds [2];
  int stderrFds [2];
  int stdinFds [2];
  
  ppcVar13 = &pcStack_78;
  if (this->pid != 0) {
    lStack_80 = 0x10759e;
    piVar8 = __errno_location();
    *piVar8 = 0x16;
    return 0;
  }
  envStringsBuf._capacity = (usize)__file;
  local_48[0] = 0;
  local_48[1] = 0;
  stdoutFds[0] = 0;
  stdoutFds[1] = 0;
  stderrFds[0] = 0;
  stderrFds[1] = 0;
  if ((in_R8D & 1) != 0) {
    lStack_80 = 0x1075d9;
    iVar6 = pipe(local_48);
    if (iVar6 != 0) goto LAB_00107601;
  }
  if ((in_R8D & 2) != 0) {
    lStack_80 = 0x1075eb;
    iVar6 = pipe(stdoutFds);
    if (iVar6 != 0) goto LAB_00107601;
  }
  if ((in_R8D & 4) != 0) {
    lStack_80 = 0x1075fd;
    iVar6 = pipe(stderrFds);
    if (iVar6 != 0) {
LAB_00107601:
      lStack_80 = 0x107606;
      piVar8 = __errno_location();
      iVar6 = *piVar8;
      if (local_48[0] != 0) {
        lStack_80 = 0x107618;
        ::close(local_48[0]);
        lStack_80 = 0x107620;
        ::close(local_48[1]);
      }
      if (stdoutFds[0] != 0) {
        lStack_80 = 0x10762c;
        ::close(stdoutFds[0]);
        lStack_80 = 0x107634;
        ::close(stdoutFds[1]);
      }
      if (stderrFds[0] != 0) {
        lStack_80 = 0x107640;
        ::close(stderrFds[0]);
        lStack_80 = 0x107648;
        ::close(stderrFds[1]);
      }
      *piVar8 = iVar6;
      return 0;
    }
  }
  if ((__oflag == 0) || (in_RCX[(long)__oflag + -1] != (char *)0x0)) {
    lVar9 = (long)(int)(__oflag + (uint)(__oflag == 0));
    lVar3 = -(lVar9 * 8 + 0x17U & 0xfffffffffffffff0);
    ppcVar13 = (char **)((long)&pcStack_78 + lVar3);
    ppcVar13[lVar9] = (char *)0x0;
    *(undefined8 *)((long)&lStack_80 + lVar3) = 1;
    uVar5 = envStringsBuf._capacity;
    for (lVar12 = *(long *)((long)&lStack_80 + lVar3); lVar12 < lVar9; lVar12 = lVar12 + 1) {
      ppcVar13[lVar12] = in_RCX[lVar12];
    }
    *(undefined8 *)((long)&lStack_80 + lVar3) = 0x1076af;
    pcVar10 = String::operator_cast_to_char_((String *)uVar5);
    *ppcVar13 = pcVar10;
    in_RCX = ppcVar13;
  }
  envStringsBuf._end.item = (String *)0x0;
  auStack_68 = (undefined1  [8])0x0;
  envStringsBuf._begin.item = (String *)0x0;
  ppcVar14 = _environ;
  if (in_R9->root != (Item *)0x0) {
    local_70 = in_RCX;
    ppcVar13[-1] = (char *)0x1076e5;
    anon_unknown.dwarf_e3e8::prepareEnv(in_R9,(Array<String> *)auStack_68);
    IVar4 = envStringsBuf._begin;
    this_00 = auStack_68;
    lVar12 = (long)envStringsBuf._begin.item - (long)auStack_68;
    ppcVar13[-1] = (char *)0x28;
    ppcVar13 = (char **)((long)ppcVar13 -
                        ((lVar12 / (long)ppcVar13[-1]) * 8 + 0x17U & 0xfffffffffffffff0));
    ppcVar14 = ppcVar13;
    for (; this_00 != (undefined1  [8])IVar4.item; this_00 = (undefined1  [8])((long)this_00 + 0x28)
        ) {
      ppcVar13[-1] = (char *)0x107720;
      pcVar10 = String::operator_cast_to_char_((String *)this_00);
      *ppcVar14 = pcVar10;
      ppcVar14 = ppcVar14 + 1;
    }
    *ppcVar14 = (char *)0x0;
    in_RCX = local_70;
    ppcVar14 = ppcVar13;
  }
  ppcVar13[-1] = (char *)0x10773d;
  uVar7 = vfork();
  if (uVar7 != 0xffffffff) {
    iVar6 = local_48[1];
    if (uVar7 != 0) {
      this->pid = uVar7;
      if (local_48[1] != 0) {
        ppcVar13[-1] = (char *)0x10780f;
        ::close(iVar6);
      }
      iVar6 = stdoutFds[1];
      if (stdoutFds[1] != 0) {
        ppcVar13[-1] = (char *)0x10781b;
        ::close(iVar6);
      }
      iVar6 = stderrFds[0];
      if (stderrFds[0] != 0) {
        ppcVar13[-1] = (char *)0x107827;
        ::close(iVar6);
      }
      this->fdStdOutRead = local_48[0];
      this->fdStdErrRead = stdoutFds[0];
      this->fdStdInWrite = stderrFds[1];
      iVar6 = (int)CONCAT71((uint7)stderrFds[1]._1_3_,1);
      goto LAB_0010783d;
    }
    if (local_48[1] != 0) {
      ppcVar13[-1] = (char *)0x1;
      uVar1 = ppcVar13[-1];
      ppcVar13[-1] = (char *)0x10775d;
      dup2(iVar6,(int)uVar1);
      iVar6 = local_48[1];
      ppcVar13[-1] = (char *)0x107765;
      ::close(iVar6);
    }
    iVar6 = stdoutFds[1];
    if (stdoutFds[1] != 0) {
      ppcVar13[-1] = (char *)0x2;
      uVar1 = ppcVar13[-1];
      ppcVar13[-1] = (char *)0x107774;
      dup2(iVar6,(int)uVar1);
      iVar6 = stdoutFds[1];
      ppcVar13[-1] = (char *)0x10777c;
      ::close(iVar6);
    }
    iVar6 = stderrFds[0];
    if (stderrFds[0] != 0) {
      ppcVar13[-1] = (char *)0x10778a;
      dup2(iVar6,0);
      iVar6 = stderrFds[0];
      ppcVar13[-1] = (char *)0x107792;
      ::close(iVar6);
    }
    iVar6 = local_48[0];
    if (local_48[0] != 0) {
      ppcVar13[-1] = (char *)0x10779e;
      ::close(iVar6);
    }
    iVar6 = stdoutFds[0];
    if (stdoutFds[0] != 0) {
      ppcVar13[-1] = (char *)0x1077aa;
      ::close(iVar6);
    }
    iVar6 = stderrFds[1];
    if (stderrFds[1] != 0) {
      ppcVar13[-1] = (char *)0x1077b6;
      ::close(iVar6);
    }
    uVar5 = envStringsBuf._capacity;
    ppcVar13[-1] = (char *)0x1077bf;
    pcVar10 = String::operator_cast_to_char_((String *)uVar5);
    ppcVar13[-1] = (char *)0x1077cd;
    iVar6 = execvpe(pcVar10,in_RCX,ppcVar14);
    uVar5 = envStringsBuf._capacity;
    __stream = _stderr;
    if (iVar6 == -1) {
      ppcVar13[-1] = (char *)0x107862;
      pcVar10 = String::operator_cast_to_char_((String *)uVar5);
      ppcVar13[-1] = (char *)0x10786a;
      piVar8 = __errno_location();
      iVar6 = *piVar8;
      ppcVar13[-1] = (char *)0x107871;
      pcVar11 = strerror(iVar6);
      ppcVar13[-1] = (char *)0x107888;
      fprintf(__stream,"%s: %s\n",pcVar10,pcVar11);
      ppcVar13[-1] = (char *)0x1;
      uVar1 = ppcVar13[-1];
      ppcVar13[-1] = (char *)0x107890;
      _exit((int)uVar1);
    }
    ppcVar13[-1] = (char *)0x1077f3;
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                          ,0x2c5,"false");
    if (iVar6 != 0) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  iVar6 = 0;
LAB_0010783d:
  ppcVar13[-1] = (char *)0x107848;
  Array<String>::~Array((Array<String> *)auStack_68);
  return iVar6;
}

Assistant:

bool Process::open(const String& executable, int argc, char* const argv[], uint streams, const Map<String, String>& environment)
{
#ifdef _WIN32
  return open(Private::getCommandLine(executable, argc, argv), streams);
#else
  if (pid)
  {
    errno = EINVAL;
    return false;
  }

  // create pipes
  int stdoutFds[2] = {};
  int stderrFds[2] = {};
  int stdinFds[2] = {};
  if (streams & stdoutStream)
  {
    if (pipe(stdoutFds) != 0)
      goto error;
  }
  if (streams & stderrStream)
  {
    if (pipe(stderrFds) != 0)
      goto error;
  }
  if (streams & stdinStream)
  {
    if (pipe(stdinFds) != 0)
      goto error;
  }

  {

    // prepare argv of child
    const char** args;
    if (argc && !argv[argc - 1])
      args = (const char**)argv;
    else
    {
      if (!argc)
        ++argc;
      args = (const char**)alloca(sizeof(const char*) * (argc + 1));
      args[argc] = 0;
      for (int i = 1; i < argc; ++i)
        args[i] = argv[i];
      args[0] = executable;
    }

    // prepare env of child
    char** env = ::environ;
    Array<String> envStringsBuf;
    if (!environment.isEmpty())
    {
      prepareEnv(environment, envStringsBuf);
      env = (char**)alloca(sizeof(char*) * (envStringsBuf.size() + 1));
      char** ienv = env;
      for (Array<String>::Iterator i = envStringsBuf.begin(), end = envStringsBuf.end(); i != end; ++i)
        *(ienv++) = (char*)(const char*)*i;
      *ienv = 0;
    }

    // start process
    {
      int r = vfork();
      if (r == -1)
        return false;
      else if (r != 0) // parent
      {
        pid = r;

        if (stdoutFds[1])
          ::close(stdoutFds[1]);
        if (stderrFds[1])
          ::close(stderrFds[1]);
        if (stdinFds[0])
          ::close(stdinFds[0]);

        fdStdOutRead = stdoutFds[0];
        fdStdErrRead = stderrFds[0];
        fdStdInWrite = stdinFds[1];

        return true;
      }
      else // child
      {
        if (stdoutFds[1])
        {
          dup2(stdoutFds[1], STDOUT_FILENO);
          ::close(stdoutFds[1]);
        }
        if (stderrFds[1])
        {
          dup2(stderrFds[1], STDERR_FILENO);
          ::close(stderrFds[1]);
        }
        if (stdinFds[0])
        {
          dup2(stdinFds[0], STDIN_FILENO);
          ::close(stdinFds[0]);
        }

        if (stdoutFds[0])
          ::close(stdoutFds[0]);
        if (stderrFds[0])
          ::close(stderrFds[0]);
        if (stdinFds[1])
          ::close(stdinFds[1]);

        if (execvpe(executable, (char* const*)args, env) == -1)
        {
          fprintf(stderr, "%s: %s\n", (const char*)executable, strerror(errno));
          _exit(EXIT_FAILURE);
        }
        ASSERT(false); // unreachable
        return false;
      }
    }
  }
error:
  int err = errno;
  if (stdoutFds[0])
  {
    ::close(stdoutFds[0]);
    ::close(stdoutFds[1]);
  }
  if (stderrFds[0])
  {
    ::close(stderrFds[0]);
    ::close(stderrFds[1]);
  }
  if (stdinFds[0])
  {
    ::close(stdinFds[0]);
    ::close(stdinFds[1]);
  }
  errno = err;
  return false;
#endif
}